

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzreducedspace.cpp
# Opt level: O1

void __thiscall
TPZReducedSpace::CreateGraphicalElement(TPZReducedSpace *this,TPZGraphMesh *grmesh,int dimension)

{
  bool bVar1;
  int matid;
  int iVar2;
  TPZGeoEl *pTVar3;
  long *plVar4;
  TPZGraphElQ2dd *pTVar5;
  TPZGraphEl1dd *this_00;
  undefined *puVar6;
  TPZGraphElPrismMapped *this_01;
  TPZGraphElPyramidMapped *this_02;
  TPZGraphElQ3dd *this_03;
  
  pTVar3 = TPZCompEl::Reference((TPZCompEl *)this);
  plVar4 = (long *)(**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0xb8
                               ))(this);
  matid = (**(code **)(*plVar4 + 0x58))(plVar4);
  iVar2 = (**(code **)(*(long *)pTVar3 + 0xf0))(pTVar3);
  bVar1 = TPZGraphMesh::Material_Is_PostProcessed(grmesh,matid);
  if ((dimension == 2) && (bVar1)) {
    if (iVar2 == 7) {
      pTVar5 = (TPZGraphElQ2dd *)operator_new(0x28);
      TPZGraphElQ2dd::TPZGraphElQ2dd(pTVar5,&PTR_PTR_019977d8,(TPZCompEl *)this,grmesh);
      puVar6 = &TPZGraphElT2dMapped::vtable;
      goto LAB_010db2a2;
    }
    if (iVar2 == 9) {
      pTVar5 = (TPZGraphElQ2dd *)operator_new(0x28);
      TPZGraphElQ2dd::TPZGraphElQ2dd(pTVar5,(TPZCompEl *)this,grmesh);
      return;
    }
  }
  if (dimension != 3 || !bVar1) {
switchD_010db216_caseD_1:
    if (dimension == 1 && bVar1) {
      this_00 = (TPZGraphEl1dd *)operator_new(0x28);
      TPZGraphEl1dd::TPZGraphEl1dd(this_00,(TPZCompEl *)this,grmesh);
    }
  }
  else {
    switch(iVar2 - 0xfU >> 1 | (uint)((iVar2 - 0xfU & 1) != 0) << 0x1f) {
    case 0:
      pTVar5 = (TPZGraphElQ2dd *)operator_new(0x28);
      TPZGraphElQ3dd::TPZGraphElQ3dd
                ((TPZGraphElQ3dd *)pTVar5,&PTR_PTR_01995b28,(TPZCompEl *)this,grmesh);
      puVar6 = &TPZGraphElT3d::vtable;
LAB_010db2a2:
      (((TPZGraphElQ3dd *)pTVar5)->super_TPZGraphEl).super_TPZSavable._vptr_TPZSavable =
           (_func_int **)(puVar6 + 0x18);
      return;
    default:
      goto switchD_010db216_caseD_1;
    case 2:
      this_02 = (TPZGraphElPyramidMapped *)operator_new(0x28);
      TPZGraphElPyramidMapped::TPZGraphElPyramidMapped(this_02,(TPZCompEl *)this,grmesh);
      break;
    case 3:
      this_01 = (TPZGraphElPrismMapped *)operator_new(0x28);
      TPZGraphElPrismMapped::TPZGraphElPrismMapped(this_01,(TPZCompEl *)this,grmesh);
      break;
    case 6:
      this_03 = (TPZGraphElQ3dd *)operator_new(0x28);
      TPZGraphElQ3dd::TPZGraphElQ3dd(this_03,(TPZCompEl *)this,grmesh);
    }
  }
  return;
}

Assistant:

void TPZReducedSpace::CreateGraphicalElement(TPZGraphMesh &grmesh, int dimension) {
	TPZGeoEl *ref = Reference();
	int matid = Material()->Id();
	int nsides = ref->NSides();
    bool to_postpro = grmesh.Material_Is_PostProcessed(matid);
	if(dimension == 2 && to_postpro){
		if(nsides == 9){
			new TPZGraphElQ2dd(this,&grmesh);
			return;
		}
		if(nsides == 7){
			new TPZGraphElT2dMapped(this,&grmesh);
			return;
		}
	}//2d
	
	if(dimension == 3 && to_postpro){
		if(nsides == 27){
			new TPZGraphElQ3dd(this,&grmesh);
			return;
		}//cube
		if(nsides == 21){
			new TPZGraphElPrismMapped(this,&grmesh);
			return;
		}//prism
		if(nsides == 15){
			new TPZGraphElT3d(this,&grmesh);
			return;
		}//tetra
		if(nsides == 19){
			new TPZGraphElPyramidMapped(this,&grmesh);
			return;
		}//pyram
	}//3d
	
	if(dimension == 1 && to_postpro){
		new TPZGraphEl1dd(this,&grmesh);
	}//1d
}